

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Mio_WriteLibrary(FILE *pFile,Mio_Library_t *pLib,int fPrintSops,int fShort,int fSelected)

{
  uint uVar1;
  void *pvVar2;
  Mio_Gate_t *pMVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  int fAllPins;
  uint *__ptr;
  void *pvVar7;
  Mio_Library_t *pLib_00;
  Mio_Cell2_t *__ptr_00;
  ulong uVar8;
  size_t sVar9;
  Mio_Pin_t *pPin;
  char *pcVar10;
  ulong uVar11;
  int FormLen;
  void **ppvVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int nCells;
  ulong local_70;
  int local_4c;
  ulong local_48;
  FILE *local_40;
  Mio_Library_t *local_38;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar7 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar7;
  fAllPins = 1;
  if (fShort == 0) {
    fAllPins = Mio_CheckGates(pLib);
  }
  local_40 = (FILE *)pFile;
  local_38 = pLib;
  if (fSelected == 0) {
    if (0 < pLib->nGates) {
      uVar14 = *__ptr;
      uVar1 = __ptr[1];
      pvVar7 = *(void **)(__ptr + 2);
      lVar15 = 0;
      do {
        pMVar3 = pLib->ppGates0[lVar15];
        if (uVar1 + (int)lVar15 == uVar14) {
          if ((int)uVar14 < 0x10) {
            if (pvVar7 == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(pvVar7,0x80);
            }
            uVar14 = 0x10;
          }
          else {
            uVar5 = uVar14 * 2;
            if (SBORROW4(uVar14,uVar5) != 0 < (int)uVar14) {
              uVar14 = uVar5;
              if (pvVar7 == (void *)0x0) {
                pvVar7 = malloc((ulong)uVar5 << 3);
              }
              else {
                pvVar7 = realloc(pvVar7,(ulong)uVar5 << 3);
              }
            }
          }
        }
        *(Mio_Gate_t **)((long)pvVar7 + lVar15 * 8 + (long)(int)uVar1 * 8) = pMVar3;
        lVar15 = lVar15 + 1;
      } while (lVar15 < pLib->nGates);
      __ptr[1] = uVar1 + (int)lVar15;
      *__ptr = uVar14;
      *(void **)(__ptr + 2) = pvVar7;
    }
  }
  else {
    pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
    __ptr_00 = Mio_CollectRootsNew2(pLib_00,6,&local_4c,0);
    if (0 < local_4c) {
      uVar14 = *__ptr;
      uVar1 = __ptr[1];
      pvVar7 = *(void **)(__ptr + 2);
      ppvVar12 = &__ptr_00->pMioGate;
      lVar15 = 0;
      do {
        pvVar2 = *ppvVar12;
        if (uVar1 + (int)lVar15 == uVar14) {
          if ((int)uVar14 < 0x10) {
            if (pvVar7 == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(pvVar7,0x80);
            }
            uVar14 = 0x10;
          }
          else {
            uVar5 = uVar14 * 2;
            if (SBORROW4(uVar14,uVar5) != 0 < (int)uVar14) {
              uVar14 = uVar5;
              if (pvVar7 == (void *)0x0) {
                pvVar7 = malloc((ulong)uVar5 << 3);
              }
              else {
                pvVar7 = realloc(pvVar7,(ulong)uVar5 << 3);
              }
            }
          }
        }
        *(void **)((long)pvVar7 + lVar15 * 8 + (long)(int)uVar1 * 8) = pvVar2;
        lVar15 = lVar15 + 1;
        ppvVar12 = ppvVar12 + 10;
      } while (lVar15 < local_4c);
      __ptr[1] = uVar1 + (int)lVar15;
      *__ptr = uVar14;
      *(void **)(__ptr + 2) = pvVar7;
    }
    if (__ptr_00 != (Mio_Cell2_t *)0x0) {
      free(__ptr_00);
    }
  }
  uVar11 = (ulong)(int)__ptr[1];
  if ((long)uVar11 < 1) {
    local_70._0_4_ = 0;
    uVar14 = 0;
    FormLen = 0;
    iVar6 = (int)local_70;
  }
  else {
    lVar15 = *(long *)(__ptr + 2);
    uVar13 = 0;
    FormLen = 0;
    uVar14 = 0;
    local_70 = 0;
    local_48 = uVar11;
    do {
      pMVar3 = *(Mio_Gate_t **)(lVar15 + uVar13 * 8);
      uVar8 = strlen(pMVar3->pName);
      if ((int)uVar8 < (int)local_70) {
        uVar8 = local_70;
      }
      local_70 = uVar8 & 0xffffffff;
      sVar9 = strlen(pMVar3->pOutName);
      uVar16 = sVar9 & 0xffffffff;
      if ((int)sVar9 < (int)uVar14) {
        uVar16 = (ulong)uVar14;
      }
      sVar9 = strlen(pMVar3->pForm);
      iVar6 = (int)sVar9;
      if ((int)sVar9 < FormLen) {
        iVar6 = FormLen;
      }
      FormLen = iVar6;
      pPin = Mio_GateReadPins(pMVar3);
      uVar11 = local_48;
      if (pPin == (Mio_Pin_t *)0x0) {
        uVar14 = (uint)uVar16;
      }
      else {
        do {
          sVar9 = strlen(pPin->pName);
          uVar14 = (uint)sVar9;
          if ((int)(uint)sVar9 < (int)(uint)uVar16) {
            uVar14 = (uint)uVar16;
          }
          pPin = Mio_PinReadNext(pPin);
          uVar16 = (ulong)uVar14;
        } while (pPin != (Mio_Pin_t *)0x0);
      }
      uVar13 = uVar13 + 1;
      iVar6 = (int)uVar8;
    } while (uVar13 != uVar11);
  }
  local_70._0_4_ = iVar6;
  pcVar4 = local_38->pName;
  pcVar10 = Extra_TimeStamp();
  fprintf(local_40,"# The genlib library \"%s\" with %d gates written by ABC on %s\n",pcVar4,
          uVar11 & 0xffffffff,pcVar10);
  if (0 < (int)uVar11) {
    lVar15 = *(long *)(__ptr + 2);
    uVar13 = 0;
    do {
      Mio_WriteGate((FILE *)local_40,*(Mio_Gate_t **)(lVar15 + uVar13 * 8),(int)local_70,uVar14,
                    FormLen,fPrintSops,fAllPins);
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Mio_WriteLibrary( FILE * pFile, Mio_Library_t * pLib, int fPrintSops, int fShort, int fSelected )
{
    Mio_Gate_t * pGate;
    Mio_Pin_t * pPin;
    Vec_Ptr_t * vGates = Vec_PtrAlloc( 1000 );
    int i, nCells, GateLen = 0, NameLen = 0, FormLen = 0;
    int fAllPins = fShort || Mio_CheckGates( pLib );
    if ( fSelected )
    {
        Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
        for ( i = 0; i < nCells; i++ )
            Vec_PtrPush( vGates, pCells[i].pMioGate );
        ABC_FREE( pCells );
    }
    else
    {
        for ( i = 0; i < pLib->nGates; i++ )
            Vec_PtrPush( vGates, pLib->ppGates0[i] );
    }
    Vec_PtrForEachEntry( Mio_Gate_t *, vGates, pGate, i )
    {
        GateLen = Abc_MaxInt( GateLen, strlen(pGate->pName) );
        NameLen = Abc_MaxInt( NameLen, strlen(pGate->pOutName) );
        FormLen = Abc_MaxInt( FormLen, strlen(pGate->pForm) );
        Mio_GateForEachPin( pGate, pPin )
            NameLen = Abc_MaxInt( NameLen, strlen(pPin->pName) );
    }
    fprintf( pFile, "# The genlib library \"%s\" with %d gates written by ABC on %s\n", pLib->pName, Vec_PtrSize(vGates), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Mio_Gate_t *, vGates, pGate, i )
        Mio_WriteGate( pFile, pGate, GateLen, NameLen, FormLen, fPrintSops, fAllPins );
    Vec_PtrFree( vGates );
}